

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall
chrono::ChFrameMoving<double>::SetPos_dtdt(ChFrameMoving<double> *this,ChVector<double> *macc)

{
  if (&this->coord_dtdt != (ChCoordsys<double> *)macc) {
    (this->coord_dtdt).pos.m_data[0] = macc->m_data[0];
    (this->coord_dtdt).pos.m_data[1] = macc->m_data[1];
    (this->coord_dtdt).pos.m_data[2] = macc->m_data[2];
  }
  return;
}

Assistant:

virtual void SetPos_dtdt(const ChVector<Real>& macc) { coord_dtdt.pos = macc; }